

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cute_reporter_tests.c
# Opt level: O3

int mocked_printf(FILE *file,char *format,...)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  va_list ap;
  char buffer [10000];
  char local_2728 [10000];
  
  __vsnprintf_chk(local_2728,10000,1,10000,format);
  pcVar3 = output;
  sVar1 = strlen(output);
  sVar2 = strlen(local_2728);
  pcVar3 = (char *)realloc(pcVar3,sVar1 + sVar2 + 1);
  strcat(pcVar3,local_2728);
  output = pcVar3;
  sVar1 = strlen(pcVar3);
  return (int)sVar1;
}

Assistant:

static int mocked_printf(const char *format, ...) {
   int result = 0;

   va_list ap;
   va_start(ap, format);
   result = mocked_vprintf(format, ap);
   va_end(ap);

   return result;
}